

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<Qt::DayOfWeek>::emplace<Qt::DayOfWeek&>
          (QPodArrayOps<Qt::DayOfWeek> *this,qsizetype i,DayOfWeek *args)

{
  bool bVar1;
  qsizetype qVar2;
  DayOfWeek *pDVar3;
  DayOfWeek *in_RDX;
  QArrayDataPointer<Qt::DayOfWeek> *in_RSI;
  long in_RDI;
  DayOfWeek *where;
  GrowthPosition pos;
  DayOfWeek tmp;
  bool detach;
  QArrayDataPointer<Qt::DayOfWeek> *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 uVar4;
  DayOfWeek DVar5;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 uVar6;
  
  bVar1 = QArrayDataPointer<Qt::DayOfWeek>::needsDetach(in_stack_ffffffffffffffd0);
  uVar6 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffe4);
  if (!bVar1) {
    if ((in_RSI == *(QArrayDataPointer<Qt::DayOfWeek> **)(in_RDI + 0x10)) &&
       (qVar2 = QArrayDataPointer<Qt::DayOfWeek>::freeSpaceAtEnd
                          ((QArrayDataPointer<Qt::DayOfWeek> *)
                           CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)),
       qVar2 != 0)) {
      pDVar3 = QArrayDataPointer<Qt::DayOfWeek>::end(in_stack_ffffffffffffffd0);
      *pDVar3 = *in_RDX;
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
      return;
    }
    if ((in_RSI == (QArrayDataPointer<Qt::DayOfWeek> *)0x0) &&
       (qVar2 = QArrayDataPointer<Qt::DayOfWeek>::freeSpaceAtBegin
                          ((QArrayDataPointer<Qt::DayOfWeek> *)
                           CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)),
       qVar2 != 0)) {
      pDVar3 = QArrayDataPointer<Qt::DayOfWeek>::begin((QArrayDataPointer<Qt::DayOfWeek> *)0x4eff4e)
      ;
      pDVar3[-1] = *in_RDX;
      *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + -4;
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
      return;
    }
  }
  DVar5 = *in_RDX;
  uVar4 = 0;
  if ((*(long *)(in_RDI + 0x10) != 0) && (in_RSI == (QArrayDataPointer<Qt::DayOfWeek> *)0x0)) {
    uVar4 = 1;
  }
  QArrayDataPointer<Qt::DayOfWeek>::detachAndGrow
            (in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20),CONCAT44(uVar6,DVar5),
             (DayOfWeek **)CONCAT44(uVar4,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd0);
  pDVar3 = createHole((QPodArrayOps<Qt::DayOfWeek> *)in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20),
                      CONCAT44(uVar6,DVar5),CONCAT44(uVar4,in_stack_ffffffffffffffd8));
  *pDVar3 = DVar5;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }